

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void lts2::RealReconstructionWithTVL1
               (Mat *x,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float lambda,
               Size patchSize,float patchMean)

{
  float fVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  long *plVar5;
  float local_6e8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  Mat u_n;
  byte local_6af;
  Mat u_;
  undefined8 *local_610;
  Mat q;
  Mat p2;
  Mat p1;
  _InputArray local_4d0 [14];
  Mat divP;
  Scalar_<double> local_310 [11];
  Mat Du2;
  Mat u_nm1;
  Mat Au;
  Mat Du1;
  
  fVar1 = (LBD->super_LinearOperator)._norm;
  cv::Mat::Mat(&u_);
  cv::Mat::Mat(&Au);
  cv::Mat::Mat(&u_n);
  cv::Mat::Mat(&u_nm1);
  cv::Mat::Mat(&Du1);
  cv::Mat::Mat(&Du2);
  cv::Mat::Mat(&p1);
  cv::Mat::Mat(&p2);
  cv::Mat::Mat(&divP);
  cv::Mat::Mat(&q);
  local_6b8 = CONCAT44((int)**(undefined8 **)(binaryDescriptor + 0x40),
                       (int)((ulong)**(undefined8 **)(binaryDescriptor + 0x40) >> 0x20));
  cv::Mat::create(&Au,&local_6b8,5);
  cv::Scalar_<double>::Scalar_(local_310,0.0);
  local_4d0[0].flags = -0x3efdfffa;
  local_4d0[0].sz.width = 1;
  local_4d0[0].sz.height = 4;
  local_4d0[0].obj = local_310;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&Au,local_4d0);
  if (*(long *)(x + 0x10) == 0) {
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,binaryDescriptor,&u_n);
    cv::Scalar_<double>::Scalar_(local_310,0.0);
    local_4d0[0].flags = -0x3efdfffa;
    local_4d0[0].sz.width = 1;
    local_4d0[0].sz.height = 4;
    local_4d0[0].obj = local_310;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&u_n,local_4d0);
  }
  else {
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (double)CONCAT44(local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                          0x2010000);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&u_n;
    cv::Mat::copyTo((_OutputArray *)x);
  }
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                        0x2010000);
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&u_;
  cv::Mat::copyTo((_OutputArray *)&u_n);
  local_6c0 = CONCAT44((int)*local_610,(int)((ulong)*local_610 >> 0x20));
  cv::Mat::create(&p1,&local_6c0,5);
  cv::Scalar_<double>::Scalar_(local_310,0.0);
  local_4d0[0].flags = -0x3efdfffa;
  local_4d0[0].sz.width = 1;
  local_4d0[0].sz.height = 4;
  local_4d0[0].obj = local_310;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&p1,local_4d0);
  local_6c8 = CONCAT44((int)*local_610,(int)((ulong)*local_610 >> 0x20));
  cv::Mat::create(&p2,&local_6c8,5);
  cv::Scalar_<double>::Scalar_(local_310,0.0);
  local_4d0[0].flags = -0x3efdfffa;
  local_4d0[0].sz.width = 1;
  local_4d0[0].sz.height = 4;
  local_4d0[0].obj = local_310;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&p2,local_4d0);
  local_6d0 = CONCAT44((int)**(undefined8 **)(binaryDescriptor + 0x40),
                       (int)((ulong)**(undefined8 **)(binaryDescriptor + 0x40) >> 0x20));
  cv::Mat::create(&q,&local_6d0,5);
  cv::Scalar_<double>::Scalar_(local_310,0.0);
  local_4d0[0].flags = -0x3efdfffa;
  local_4d0[0].sz.width = 1;
  local_4d0[0].sz.height = 4;
  local_4d0[0].obj = local_310;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&q,local_4d0);
  plVar5 = (long *)(double)(1.0 / SQRT(fVar1 * fVar1 + 8.0));
  local_6e8 = -lambda;
  iVar3 = 0;
  if (0 < iterations) {
    iVar3 = iterations;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    HorizontalGradientWithForwardScheme(&u_,&Du1);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)plVar5;
    cv::operator*=(&Du1,(double *)local_310);
    cv::operator+=(&p1,&Du1);
    VerticalGradientWithForwardScheme(&u_,&Du2);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)plVar5;
    cv::operator*=(&Du2,(double *)local_310);
    cv::operator+=(&p2,&Du2);
    ProxL2UnitBall(&p1,&p2);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,&u_,&Au);
    cv::operator-=(&Au,binaryDescriptor);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)plVar5;
    cv::operator*=(&Au,(double *)local_310);
    cv::operator+=(&q,&Au);
    ProxRangeConstraint(&q,local_6e8,lambda);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (double)CONCAT44(local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                          0x2010000);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&u_nm1;
    cv::Mat::copyTo((_OutputArray *)&u_n);
    DivergenceWithBackwardScheme(&p1,&p2,&divP);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)plVar5;
    cv::operator*=(&divP,(double *)local_310);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,&q,&Au);
    local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)plVar5;
    cv::operator*=(&Au,(double *)local_310);
    cv::operator-=(&u_n,&Au);
    cv::operator+=(&u_n,&divP);
    if ((local_6af & 0x40) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"OOOOOOPS, things can go wild...");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    ProxMeanConstraint(&u_n,patchMean);
    ProxRangeConstraint(&u_n,0.0,1.0);
    cv::operator*(2.0,(Mat *)local_4d0);
    cv::operator-((MatExpr *)local_310,(Mat *)local_4d0);
    (**(code **)(*(long *)local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] + 0x18))
              (local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0],
               (MatExpr *)local_310,&u_,0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_310);
    cv::MatExpr::~MatExpr((MatExpr *)local_4d0);
  }
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                        0x2010000);
  local_310[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)x;
  cv::Mat::copyTo((_OutputArray *)&u_n);
  cv::Mat::~Mat(&q);
  cv::Mat::~Mat(&divP);
  cv::Mat::~Mat(&p2);
  cv::Mat::~Mat(&p1);
  cv::Mat::~Mat(&Du2);
  cv::Mat::~Mat(&Du1);
  cv::Mat::~Mat(&u_nm1);
  cv::Mat::~Mat(&u_n);
  cv::Mat::~Mat(&Au);
  cv::Mat::~Mat(&u_);
  return;
}

Assistant:

void lts2::RealReconstructionWithTVL1(cv::Mat &x, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                     int iterations, float lambda, cv::Size patchSize, float patchMean)
{
  // Numerical parameters
  float L2 = 8.0f + LBD.norm() * LBD.norm();    // 8 is for TV
  float tau = 1.0f / std::sqrt(L2);   // L^2 * tau * sigma = 1
  float sigma = 1.0f / std::sqrt(L2); // L^2 * tau * sigma = 1

  // Auxiliary variables
  cv::Mat u_, Au, u_n, u_nm1, Du1, Du2;
  cv::Mat p1, p2, divP;       // Dual variables for TV
  cv::Mat q;                  // Dual variable for A

  // We observe g, hence g and Au have the same dimensions
  Au.create(binaryDescriptor.size(), CV_32F);
  Au.setTo(cv::Scalar(0));

  // The size of u may not be the same as the size of g (e.g. A is a projection)
  // so we guess the size of u either from a non-zero input, or from the application
  // of A^t.
  if (x.data)
    x.copyTo(u_n);
  else
  {
    LBD.ApplyConjugate(binaryDescriptor, u_n);
    u_n.setTo(cv::Scalar(0));
  }

  u_n.copyTo(u_);

  p1.create(u_.size(), CV_32FC1);
  p1.setTo(cv::Scalar(0));
  p2.create(u_.size(), CV_32FC1);
  p2.setTo(cv::Scalar(0));

  q.create(binaryDescriptor.size(), CV_32F);
  q.setTo(cv::Scalar(0));

  // Main loop
  for (int i = 0; i < iterations; ++i)
  {
    //-------------------------------
    // Solve the dual (F^\star, K)
    //-------------------------------

    // K = (\nabla, A)
    // Apply K to U_, add to the dual variable

    // First part: TV
    lts2::HorizontalGradientWithForwardScheme(u_, Du1);
    Du1 *= sigma;
    p1 += Du1;

    lts2::VerticalGradientWithForwardScheme(u_, Du2);
    Du2 *= sigma;
    p2 += Du2;

    lts2::ProxL2UnitBall(p1, p2);

    // Second part: Au
    LBD.Apply(u_, Au);
    Au -= binaryDescriptor;
    Au *= sigma;
    q += Au;
    lts2::ProxRangeConstraint(q, -lambda, lambda);

    // Compute the prox

    //-------------------------------
    // Solve the primal (G, K^\star)
    //-------------------------------

    // Save the current estimate
    u_n.copyTo(u_nm1);

    // Apply K^\star to the dual variable
    // TV
    lts2::DivergenceWithBackwardScheme(p1, p2, divP);
    divP *= tau;

    // Operator A
    LBD.ApplyConjugate(q, Au);
    Au *= tau;

    // Solve the prox                                                                                                                                                   
    u_n -= Au;
    u_n += divP;

    // Enforce the range of the data [0, 1] and the mean
    if (!u_n.isContinuous())
      std::cerr << "OOOOOOPS, things can go wild..." << std::endl;

    lts2::ProxMeanConstraint(u_n, patchMean);
    lts2::ProxRangeConstraint(u_n, 0.0, 1.0);

    //-------------------------------
    // Next iteration
    //-------------------------------
    u_ = 2.0f * u_n - u_nm1;
  }

  u_n.copyTo(x);
}